

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.h
# Opt level: O3

bool __thiscall Kumu::AttributeVisitor::Element(AttributeVisitor *this,XMLElement *e)

{
  size_t __n;
  int iVar1;
  XMLElement *pXVar2;
  
  pXVar2 = *(XMLElement **)e;
  if (pXVar2 != e) {
    do {
      __n = *(size_t *)(pXVar2 + 0x18);
      if (__n == (this->attr_name)._M_string_length) {
        if (__n != 0) {
          iVar1 = bcmp(*(void **)(pXVar2 + 0x10),(this->attr_name)._M_dataplus._M_p,__n);
          if (iVar1 != 0) goto LAB_0014c038;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->value_list,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (pXVar2 + 0x30));
      }
LAB_0014c038:
      pXVar2 = *(XMLElement **)pXVar2;
    } while (pXVar2 != e);
  }
  return true;
}

Assistant:

bool Element(const XMLElement& e)
    {
      const AttributeList& l = e.GetAttributes();
      AttributeList::const_iterator i;
 
      for ( i = l.begin(); i != l.end(); ++i )
	{
	  if ( i->name == attr_name )
	    {
	      value_list.insert(i->value);
	    }
	}

      return true;
    }